

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_analyze.hpp
# Opt level: O2

idx_t duckdb::PatasFinalAnalyze<float>(AnalyzeState *state)

{
  InternalException *this;
  allocator local_39;
  string local_38;
  
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Patas has been deprecated, can no longer be used to compress data"
             ,&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t PatasFinalAnalyze(AnalyzeState &state) {
	throw InternalException("Patas has been deprecated, can no longer be used to compress data");
}